

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

bool MeCab::anon_unknown_20::partial_match(char *f1,char *f2)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char **ppcVar5;
  char **max;
  unsigned_long *puVar6;
  char *in_RSI;
  char *in_RDI;
  size_t i;
  size_t n;
  size_t n2;
  size_t n1;
  scoped_fixed_array<char_*,_64> c2;
  scoped_fixed_array<char_*,_64> c1;
  scoped_fixed_array<char,_8192> buf2;
  scoped_fixed_array<char,_8192> buf1;
  scoped_fixed_array<char_*,_64> *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffef0;
  char **in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  size_t local_a8;
  size_t local_98;
  char *local_90;
  scoped_fixed_array<char_*,_64> local_88;
  scoped_fixed_array<char_*,_64> local_70;
  scoped_fixed_array<char,_8192> local_48;
  scoped_fixed_array<char,_8192> local_30;
  char *local_18;
  char *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = strcmp(in_RDI,"*");
  if (iVar2 == 0) {
    local_1 = 1;
  }
  else {
    scoped_fixed_array<char,_8192>::scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffec0);
    scoped_fixed_array<char,_8192>::scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffec0);
    scoped_fixed_array<char_*,_64>::scoped_fixed_array(in_stack_fffffffffffffec0);
    scoped_fixed_array<char_*,_64>::scoped_fixed_array(in_stack_fffffffffffffec0);
    pcVar3 = scoped_fixed_array<char,_8192>::get(&local_30);
    sVar4 = scoped_fixed_array<char,_8192>::size(&local_30);
    strncpy(pcVar3,local_10,sVar4);
    pcVar3 = scoped_fixed_array<char,_8192>::get(&local_48);
    sVar4 = scoped_fixed_array<char,_8192>::size(&local_48);
    strncpy(pcVar3,local_18,sVar4);
    scoped_fixed_array<char,_8192>::get(&local_30);
    scoped_fixed_array<char_*,_64>::get(&local_70);
    scoped_fixed_array<char_*,_64>::size(&local_70);
    pcVar3 = (char *)tokenizeCSV<char**>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                         in_stack_fffffffffffffef0);
    local_90 = pcVar3;
    ppcVar5 = (char **)scoped_fixed_array<char,_8192>::get(&local_48);
    max = scoped_fixed_array<char_*,_64>::get(&local_88);
    scoped_fixed_array<char_*,_64>::size(&local_88);
    local_98 = tokenizeCSV<char**>(pcVar3,ppcVar5,(size_t)max);
    puVar6 = std::min<unsigned_long>((unsigned_long *)&local_90,&local_98);
    uVar1 = *puVar6;
    for (local_a8 = 0; local_a8 < uVar1; local_a8 = local_a8 + 1) {
      ppcVar5 = scoped_fixed_array<char_*,_64>::operator[](&local_70,local_a8);
      iVar2 = strcmp(*ppcVar5,"*");
      if (iVar2 != 0) {
        ppcVar5 = scoped_fixed_array<char_*,_64>::operator[](&local_70,local_a8);
        in_stack_fffffffffffffec0 = (scoped_fixed_array<char_*,_64> *)*ppcVar5;
        ppcVar5 = scoped_fixed_array<char_*,_64>::operator[](&local_88,local_a8);
        iVar2 = strcmp((char *)in_stack_fffffffffffffec0,*ppcVar5);
        if (iVar2 != 0) {
          local_1 = 0;
          goto LAB_00130f92;
        }
      }
    }
    local_1 = 1;
LAB_00130f92:
    scoped_fixed_array<char_*,_64>::~scoped_fixed_array(in_stack_fffffffffffffec0);
    scoped_fixed_array<char_*,_64>::~scoped_fixed_array(in_stack_fffffffffffffec0);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffec0);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffec0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

inline bool partial_match(const char *f1, const char *f2) {
  if (std::strcmp(f1, "*") == 0) {
    return true;
  }

  scoped_fixed_array<char, BUF_SIZE> buf1;
  scoped_fixed_array<char, BUF_SIZE> buf2;
  scoped_fixed_array<char *, 64> c1;
  scoped_fixed_array<char *, 64> c2;

  std::strncpy(buf1.get(), f1, buf1.size());
  std::strncpy(buf2.get(), f2, buf2.size());

  const size_t n1 = tokenizeCSV(buf1.get(), c1.get(), c1.size());
  const size_t n2 = tokenizeCSV(buf2.get(), c2.get(), c2.size());
  const size_t n  = std::min(n1, n2);

  for (size_t i = 0; i < n; ++i) {
    if (std::strcmp(c1[i], "*") != 0 &&
        std::strcmp(c1[i], c2[i]) != 0) {
      return false;
    }
  }

  return true;
}